

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::selectSingleChild
                   (Symbol *symbol,BitSelectSyntax *syntax,ASTContext *context,LookupResult *result)

{
  SVInt *this;
  optional<int> oVar1;
  bool bVar2;
  int32_t iVar3;
  ExpressionSyntax *syntax_00;
  int *piVar4;
  Scope *pSVar5;
  Diagnostic *pDVar6;
  Diagnostic *this_00;
  reference ppSVar7;
  SourceRange sourceRange;
  Diagnostic *diag_1;
  SVInt local_b8;
  uint8_t local_a1;
  GenerateBlockSymbol *local_a0;
  GenerateBlockSymbol *entry;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL> *__range3;
  GenerateBlockArraySymbol *array_1;
  undefined4 local_6c;
  SourceRange local_68;
  DiagCode local_54;
  Diagnostic *local_50;
  Diagnostic *diag;
  InstanceArraySymbol *array;
  _Optional_payload_base<int> local_38;
  optional<int> index;
  LookupResult *result_local;
  ASTContext *context_local;
  BitSelectSyntax *syntax_local;
  Symbol *symbol_local;
  
  index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)result;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
  memset(&array,0,8);
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&array);
  local_38 = (_Optional_payload_base<int>)
             ASTContext::evalInteger(context,syntax_00,(bitmask<slang::ast::ASTFlags>)array);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar2) {
    if (symbol->kind == InstanceArray) {
      diag = (Diagnostic *)Symbol::as<slang::ast::InstanceArraySymbol>(symbol);
      bVar2 = nonstd::span_lite::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
              empty(&((InstanceArraySymbol *)diag)->elements);
      if (bVar2) {
        symbol_local = (Symbol *)0x0;
      }
      else {
        pDVar6 = diag + 1;
        piVar4 = std::optional<int>::operator*((optional<int> *)&local_38);
        bVar2 = ConstantRange::containsPoint
                          ((ConstantRange *)
                           &(pDVar6->args).
                            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,*piVar4);
        oVar1 = index;
        if (bVar2) {
          this_00 = diag + 1;
          pDVar6 = diag + 1;
          piVar4 = std::optional<int>::operator*((optional<int> *)&local_38);
          iVar3 = ConstantRange::translateIndex
                            ((ConstantRange *)
                             &(pDVar6->args).
                              super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,*piVar4);
          ppSVar7 = nonstd::span_lite::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>
                    ::operator[]((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                                 this_00,(long)iVar3);
          symbol_local = *ppSVar7;
        }
        else {
          pSVar5 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
          local_54.subsystem = Lookup;
          local_54.code = 0x27;
          local_68 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pDVar6 = LookupResult::addDiag
                             ((LookupResult *)
                              oVar1.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>,pSVar5,local_54,local_68);
          local_50 = pDVar6;
          piVar4 = std::optional<int>::operator*((optional<int> *)&local_38);
          Diagnostic::operator<<(pDVar6,*piVar4);
          local_6c = 0x40001;
          array_1 = *(GenerateBlockArraySymbol **)&symbol->location;
          Diagnostic::addNote(local_50,(DiagCode)0x40001,(SourceLocation)array_1);
          symbol_local = (Symbol *)0x0;
        }
      }
    }
    else {
      __range3 = (span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL> *)
                 Symbol::as<slang::ast::GenerateBlockArraySymbol>(symbol);
      if ((((GenerateBlockArraySymbol *)__range3)->valid & 1U) == 0) {
        symbol_local = (Symbol *)0x0;
      }
      else {
        __begin3 = (iterator)&((GenerateBlockArraySymbol *)__range3)->entries;
        __end3 = nonstd::span_lite::
                 span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL>::begin
                           ((span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL>
                             *)__begin3);
        entry = (GenerateBlockSymbol *)
                nonstd::span_lite::
                span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL>::end
                          ((span<const_slang::ast::GenerateBlockSymbol_*const,_18446744073709551615UL>
                            *)__begin3);
        for (; oVar1.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int> =
                    index.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>, (GenerateBlockSymbol *)__end3 != entry;
            __end3 = __end3 + 1) {
          local_a0 = *__end3;
          this = local_a0->arrayIndex;
          piVar4 = std::optional<int>::operator*((optional<int> *)&local_38);
          SVInt::SVInt<int,void>(&local_b8,*piVar4);
          local_a1 = (uint8_t)SVInt::operator==(this,&local_b8);
          bVar2 = operator&&(this != (SVInt *)0x0,(logic_t)local_a1);
          SVInt::~SVInt(&local_b8);
          if (bVar2) {
            return &local_a0->super_Symbol;
          }
        }
        pSVar5 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        pDVar6 = LookupResult::addDiag
                           ((LookupResult *)
                            oVar1.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>,pSVar5,(DiagCode)0x27000a,sourceRange)
        ;
        piVar4 = std::optional<int>::operator*((optional<int> *)&local_38);
        Diagnostic::operator<<(pDVar6,*piVar4);
        Diagnostic::addNote(pDVar6,(DiagCode)0x40001,symbol->location);
        symbol_local = (Symbol *)0x0;
      }
    }
  }
  else {
    symbol_local = (Symbol *)0x0;
  }
  return symbol_local;
}

Assistant:

static const Symbol* selectSingleChild(const Symbol& symbol, const BitSelectSyntax& syntax,
                                       const ASTContext& context, LookupResult& result) {
    auto index = context.evalInteger(*syntax.expr);
    if (!index)
        return nullptr;

    if (symbol.kind == SymbolKind::InstanceArray) {
        auto& array = symbol.as<InstanceArraySymbol>();
        if (array.elements.empty())
            return nullptr;

        if (!array.range.containsPoint(*index)) {
            auto& diag = result.addDiag(*context.scope, diag::ScopeIndexOutOfRange,
                                        syntax.sourceRange());
            diag << *index;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return nullptr;
        }

        return array.elements[size_t(array.range.translateIndex(*index))];
    }
    else {
        auto& array = symbol.as<GenerateBlockArraySymbol>();
        if (!array.valid)
            return nullptr;

        for (auto entry : array.entries) {
            if (entry->arrayIndex && *entry->arrayIndex == *index)
                return entry;
        }

        auto& diag = result.addDiag(*context.scope, diag::ScopeIndexOutOfRange,
                                    syntax.sourceRange());
        diag << *index;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return nullptr;
    }
}